

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O1

void __thiscall Object_Nested_Test<char>::~Object_Nested_Test(Object_Nested_Test<char> *this)

{
  (this->super_Object<char>).super_Test._vptr_Test = (_func_int **)&PTR__Object_001f2a40;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&(this->super_Object<char>).out);
  std::ios_base::~ios_base((ios_base *)&(this->super_Object<char>).field_0x80);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x188);
  return;
}

Assistant:

TYPED_TEST (Object, Nested) {
    using namespace ::pstore::dump;
    object v{{
        {"k1", make_value (std::string ("value1"))},
        {"k2", make_value (object::container{
                   {"ik1", make_value ("iv1")},
                   {"ik2", make_value ("iv2")},
               })},
    }};
    v.write (this->out);
    auto const actual = this->out.str ();
    auto const expected = convert<TypeParam> ("k1 : value1\n"
                                              "k2 : \n"
                                              "    ik1 : iv1\n"
                                              "    ik2 : iv2");
    EXPECT_EQ (expected, actual);
}